

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.h
# Opt level: O1

void __thiscall AI::Task::Task(Task *this,Task *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  _Bit_type *p_Var4;
  undefined8 uVar5;
  int iVar6;
  TaskIdentifier TVar7;
  bool bVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  (this->preconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->preconditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->preconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->preconditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->preconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->preconditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->preconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->preconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->preconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->preconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->preconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->preconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->preconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->preconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->preconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->preconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->preconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->preconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->preconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->preconditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->preconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_1->preconditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->preconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->preconditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->preconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->preconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->preconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->preconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->preconditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->preconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->preconditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->preconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->preconditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->preconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->preconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->preconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->preconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->preconditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->preconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->preconditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->preconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->preconditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->preconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->preconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->preconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->preconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->preconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->preconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->preconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->preconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->preconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->preconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->preconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->preconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->postconditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->postconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->postconditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->postconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->postconditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->postconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->postconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->postconditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->postconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->postconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->postconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->postconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->postconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->postconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->postconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->postconditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->postconditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->postconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_1->postconditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->postconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->postconditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->postconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->postconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->postconditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->postconditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->postconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->postconditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->postconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->postconditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->postconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->postconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->postconditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->postconditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->postconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->postconditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->postconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->postconditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->postconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->postconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->postconditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->postconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->postconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->postconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->postconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->postconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->postconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->postconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->postconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->postconditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakConditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->breakConditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->breakConditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->breakConditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->breakConditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->breakConditions).requiredFlags.
       super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->breakConditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->breakConditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->breakConditions).requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakConditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->breakConditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->breakConditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->breakConditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->breakConditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->breakConditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->breakConditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->breakConditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->breakConditions).requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakConditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->breakConditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->breakConditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_1->breakConditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->breakConditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->breakConditions).satisfiedPredicates.
       super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->breakConditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->breakConditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->breakConditions).satisfiedPredicates.
  super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakConditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->breakConditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->breakConditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->breakConditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->breakConditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->breakConditions).consumableFlags.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->breakConditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->breakConditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->breakConditions).consumableFlags.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakConditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->breakConditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->breakConditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->breakConditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->breakConditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->breakConditions).consumableValues.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->breakConditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->breakConditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->breakConditions).consumableValues.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakConditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->breakConditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->breakConditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->breakConditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->breakConditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->breakConditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->breakConditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->breakConditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->breakConditions).consumableVectors.
  super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->type = param_1->type;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->remainingRepeats = param_1->remainingRepeats;
  iVar6 = param_1->maxRepeats;
  this->parentTaskIndex = param_1->parentTaskIndex;
  this->maxRepeats = iVar6;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->modifiedFlags)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->modifiedValues)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->modifiedValues)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->modifiedVectors)._M_t._M_impl.super__Rb_tree_header);
  TVar7 = param_1->identifier;
  this->action = param_1->action;
  this->identifier = TVar7;
  *(undefined8 *)&(this->setup).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->setup).super__Function_base._M_functor + 8) = 0;
  (this->setup).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->setup)._M_invoker = (param_1->setup)._M_invoker;
  if ((param_1->setup).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(param_1->setup).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->setup).super__Function_base._M_functor =
         *(undefined8 *)&(param_1->setup).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->setup).super__Function_base._M_functor + 8) = uVar3;
    (this->setup).super__Function_base._M_manager = (param_1->setup).super__Function_base._M_manager
    ;
    (param_1->setup).super__Function_base._M_manager = (_Manager_type)0x0;
    (param_1->setup)._M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->finish).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->finish).super__Function_base._M_functor + 8) = 0;
  (this->finish).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->finish)._M_invoker = (param_1->finish)._M_invoker;
  if ((param_1->finish).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(param_1->finish).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->finish).super__Function_base._M_functor =
         *(undefined8 *)&(param_1->finish).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->finish).super__Function_base._M_functor + 8) = uVar3;
    (this->finish).super__Function_base._M_manager =
         (param_1->finish).super__Function_base._M_manager;
    (param_1->finish).super__Function_base._M_manager = (_Manager_type)0x0;
    (param_1->finish)._M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->finally).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->finally).super__Function_base._M_functor + 8) = 0;
  (this->finally).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->finally)._M_invoker = (param_1->finally)._M_invoker;
  if ((param_1->finally).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(param_1->finally).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->finally).super__Function_base._M_functor =
         *(undefined8 *)&(param_1->finally).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->finally).super__Function_base._M_functor + 8) = uVar3;
    (this->finally).super__Function_base._M_manager =
         (param_1->finally).super__Function_base._M_manager;
    (param_1->finally).super__Function_base._M_manager = (_Manager_type)0x0;
    (param_1->finally)._M_invoker = (_Invoker_type)0x0;
  }
  *(undefined8 *)&(this->loop).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->loop).super__Function_base._M_functor + 8) = 0;
  (this->loop).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->loop)._M_invoker = (param_1->loop)._M_invoker;
  if ((param_1->loop).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(param_1->loop).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->loop).super__Function_base._M_functor =
         *(undefined8 *)&(param_1->loop).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->loop).super__Function_base._M_functor + 8) = uVar3;
    (this->loop).super__Function_base._M_manager = (param_1->loop).super__Function_base._M_manager;
    (param_1->loop).super__Function_base._M_manager = (_Manager_type)0x0;
    (param_1->loop)._M_invoker = (_Invoker_type)0x0;
  }
  paVar1 = &(this->debugName).field_2;
  (this->debugName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->debugName)._M_dataplus._M_p;
  paVar9 = &(param_1->debugName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar9) {
    uVar3 = *(undefined8 *)((long)&(param_1->debugName).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->debugName).field_2 + 8) = uVar3;
  }
  else {
    (this->debugName)._M_dataplus._M_p = pcVar2;
    (this->debugName).field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  (this->debugName)._M_string_length = (param_1->debugName)._M_string_length;
  (param_1->debugName)._M_dataplus._M_p = (pointer)paVar9;
  (param_1->debugName)._M_string_length = 0;
  (param_1->debugName).field_2._M_local_buf[0] = '\0';
  bVar8 = param_1->isLastInCompound;
  this->isImmediate = param_1->isImmediate;
  this->isLastInCompound = bVar8;
  this->failed = param_1->failed;
  (this->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->parameters).vectors.
       super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->parameters).vectors.
       super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->parameters).vectors.
       super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->parameters).vectors.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->parameters).values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       (param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_end_of_storage;
  p_Var4 = (param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar3 = *(undefined8 *)
           ((long)&(param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8);
  uVar5 = *(undefined8 *)
           ((long)&(param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
  (this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  *(undefined8 *)
   ((long)&(this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = uVar5;
  (this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = p_Var4;
  *(undefined8 *)
   ((long)&(this->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = uVar3;
  (param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (param_1->parameters).flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  return;
}

Assistant:

Task(std::string debugName, TaskType type = TaskType::Simple)
			: type{type}, debugName{debugName}
			{}